

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O2

void __thiscall
spirv_cross::CompilerGLSL::emit_buffer_reference_block
          (CompilerGLSL *this,uint32_t type_id,bool forward_declaration)

{
  unordered_map<spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>_>
  *this_00;
  TypedID<(spirv_cross::Types)1> *pTVar1;
  bool bVar2;
  uint uVar3;
  uint32_t uVar4;
  SPIRType *pSVar5;
  mapped_type *pmVar6;
  iterator iVar7;
  iterator iVar8;
  SPIRType *type;
  TypedID<(spirv_cross::Types)0> *ts_1;
  string *name;
  uint *ts_1_00;
  undefined7 in_register_00000011;
  ID *__k;
  ParsedIR *this_01;
  long lVar9;
  ulong uVar10;
  uint32_t alignment;
  uint32_t type_id_local;
  string decorations;
  string buffer_name;
  Bitset flags;
  string local_1a0;
  SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
  attributes;
  
  type_id_local = type_id;
  pSVar5 = Compiler::get<spirv_cross::SPIRType>(&this->super_Compiler,type_id);
  buffer_name._M_dataplus._M_p = (pointer)&buffer_name.field_2;
  buffer_name._M_string_length = 0;
  buffer_name.field_2._M_local_buf[0] = '\0';
  if ((int)CONCAT71(in_register_00000011,forward_declaration) == 0) {
LAB_002cfcd3:
    ts_1_00 = (uint *)0x0;
    (*(this->super_Compiler)._vptr_Compiler[0x13])(&attributes,this,pSVar5);
    ::std::__cxx11::string::operator=((string *)&buffer_name,(string *)&attributes);
    ::std::__cxx11::string::~string((string *)&attributes);
    if (!forward_declaration) {
      iVar8 = ::std::
              _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_spirv_cross::Compiler::PhysicalBlockMeta>,_std::allocator<std::pair<const_unsigned_int,_spirv_cross::Compiler::PhysicalBlockMeta>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
              ::find(&(this->super_Compiler).physical_storage_type_to_alignment._M_h,&type_id_local)
      ;
      alignment = 0;
      if (iVar8.
          super__Node_iterator_base<std::pair<const_unsigned_int,_spirv_cross::Compiler::PhysicalBlockMeta>,_false>
          ._M_cur != (__node_type *)0x0) {
        alignment = *(uint32_t *)
                     ((long)iVar8.
                            super__Node_iterator_base<std::pair<const_unsigned_int,_spirv_cross::Compiler::PhysicalBlockMeta>,_false>
                            ._M_cur + 0xc);
      }
      bVar2 = Compiler::is_physical_pointer_to_buffer_block(&this->super_Compiler,pSVar5);
      if (bVar2) {
        attributes.
        super_VectorView<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        .ptr = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               &attributes.stack_storage;
        attributes.
        super_VectorView<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        .buffer_size = 0;
        attributes.buffer_capacity = 8;
        ::std::__cxx11::string::string
                  ((string *)&flags,"buffer_reference",(allocator *)&decorations);
        SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
        ::push_back(&attributes,
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&flags);
        ::std::__cxx11::string::~string((string *)&flags);
        if (alignment != 0) {
          join<char_const(&)[26],unsigned_int&>
                    ((string *)&flags,(spirv_cross *)0x3a2777,(char (*) [26])&alignment,ts_1_00);
          SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
          ::push_back(&attributes,
                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&flags);
          ::std::__cxx11::string::~string((string *)&flags);
        }
        buffer_to_packing_standard_abi_cxx11_((string *)&flags,this,pSVar5,true,true);
        SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
        ::push_back(&attributes,
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&flags);
        ::std::__cxx11::string::~string((string *)&flags);
        ParsedIR::get_buffer_block_type_flags(&flags,&(this->super_Compiler).ir,pSVar5);
        decorations._M_dataplus._M_p = (pointer)&decorations.field_2;
        decorations._M_string_length = 0;
        decorations.field_2._M_local_buf[0] = '\0';
        uVar3 = (uint)flags.lower;
        if ((uVar3 >> 0x13 & 1) != 0) {
          ::std::__cxx11::string::append((char *)&decorations);
          uVar3 = (uint)flags.lower;
        }
        if ((uVar3 >> 0x17 & 1) != 0) {
          ::std::__cxx11::string::append((char *)&decorations);
          uVar3 = (uint)flags.lower;
        }
        if ((uVar3 >> 0x19 & 1) != 0) {
          ::std::__cxx11::string::append((char *)&decorations);
          uVar3 = (uint)flags.lower;
        }
        if ((uVar3 >> 0x18 & 1) != 0) {
          ::std::__cxx11::string::append((char *)&decorations);
        }
        merge(&local_1a0,&attributes,", ");
        statement<char_const(&)[8],std::__cxx11::string,char_const(&)[2],std::__cxx11::string&,char_const(&)[9],std::__cxx11::string&>
                  (this,(char (*) [8])"layout(",&local_1a0,(char (*) [2])0x3a9fc7,&decorations,
                   (char (*) [9])0x3a27a9,&buffer_name);
        ::std::__cxx11::string::~string((string *)&local_1a0);
        ::std::__cxx11::string::~string((string *)&decorations);
        ::std::
        _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
        ::~_Hashtable(&flags.higher._M_h);
        SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
        ::~SmallVector(&attributes);
      }
      else {
        flags.lower = (uint64_t)&flags.higher._M_h._M_bucket_count;
        flags.higher._M_h._M_buckets = (__buckets_ptr)0x0;
        flags.higher._M_h._M_bucket_count._0_1_ = 0;
        if (pSVar5->basetype == Struct) {
          buffer_to_packing_standard_abi_cxx11_(&decorations,this,pSVar5,true,false);
          ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &attributes,&decorations,", ");
          ::std::__cxx11::string::operator=((string *)&flags,(string *)&attributes);
          ::std::__cxx11::string::~string((string *)&attributes);
          ::std::__cxx11::string::~string((string *)&decorations);
        }
        else {
          type = Compiler::get_pointee_type(&this->super_Compiler,pSVar5);
          bVar2 = Compiler::is_array(&this->super_Compiler,type);
          if (bVar2) {
            attributes.stack_storage.aligned_char._8_8_ =
                 attributes.stack_storage.aligned_char + 0x20;
            attributes.
            super_VectorView<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            .ptr = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &PTR__SPIRType_004e8f68;
            attributes.
            super_VectorView<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            .buffer_size = 0x1e00000000;
            attributes.buffer_capacity = 0;
            attributes.stack_storage.aligned_char[0] = '\x01';
            attributes.stack_storage.aligned_char[1] = '\0';
            attributes.stack_storage.aligned_char[2] = '\0';
            attributes.stack_storage.aligned_char[3] = '\0';
            attributes.stack_storage.aligned_char[0x10] = '\0';
            attributes.stack_storage.aligned_char[0x11] = '\0';
            attributes.stack_storage.aligned_char[0x12] = '\0';
            attributes.stack_storage.aligned_char[0x13] = '\0';
            attributes.stack_storage.aligned_char[0x14] = '\0';
            attributes.stack_storage.aligned_char[0x15] = '\0';
            attributes.stack_storage.aligned_char[0x16] = '\0';
            attributes.stack_storage.aligned_char[0x17] = '\0';
            attributes.stack_storage.aligned_char[0x18] = '\b';
            attributes.stack_storage.aligned_char[0x19] = '\0';
            attributes.stack_storage.aligned_char[0x1a] = '\0';
            attributes.stack_storage.aligned_char[0x1b] = '\0';
            attributes.stack_storage.aligned_char[0x1c] = '\0';
            attributes.stack_storage.aligned_char[0x1d] = '\0';
            attributes.stack_storage.aligned_char[0x1e] = '\0';
            attributes.stack_storage.aligned_char[0x1f] = '\0';
            attributes.stack_storage.aligned_char._64_8_ =
                 attributes.stack_storage.aligned_char + 0x58;
            attributes.stack_storage.aligned_char[0x48] = '\0';
            attributes.stack_storage.aligned_char[0x49] = '\0';
            attributes.stack_storage.aligned_char[0x4a] = '\0';
            attributes.stack_storage.aligned_char[0x4b] = '\0';
            attributes.stack_storage.aligned_char[0x4c] = '\0';
            attributes.stack_storage.aligned_char[0x4d] = '\0';
            attributes.stack_storage.aligned_char[0x4e] = '\0';
            attributes.stack_storage.aligned_char[0x4f] = '\0';
            attributes.stack_storage.aligned_char[0x50] = '\b';
            attributes.stack_storage.aligned_char[0x51] = '\0';
            attributes.stack_storage.aligned_char[0x52] = '\0';
            attributes.stack_storage.aligned_char[0x53] = '\0';
            attributes.stack_storage.aligned_char[0x54] = '\0';
            attributes.stack_storage.aligned_char[0x55] = '\0';
            attributes.stack_storage.aligned_char[0x56] = '\0';
            attributes.stack_storage.aligned_char[0x57] = '\0';
            attributes.stack_storage.aligned_char[0x60] = '\0';
            attributes.stack_storage.aligned_char[0x61] = '\0';
            attributes.stack_storage.aligned_char[0x62] = '\0';
            attributes.stack_storage.aligned_char[99] = '\0';
            attributes.stack_storage.aligned_char[100] = '\0';
            attributes.stack_storage.aligned_char[0x65] = '\0';
            attributes.stack_storage.aligned_char[0x68] = '\b';
            attributes.stack_storage.aligned_char[0x69] = '\0';
            attributes.stack_storage.aligned_char[0x6a] = '\0';
            attributes.stack_storage.aligned_char[0x6b] = '\0';
            attributes.stack_storage.aligned_char._112_8_ =
                 attributes.stack_storage.aligned_char + 0x88;
            attributes.stack_storage.aligned_char[0x78] = '\0';
            attributes.stack_storage.aligned_char[0x79] = '\0';
            attributes.stack_storage.aligned_char[0x7a] = '\0';
            attributes.stack_storage.aligned_char[0x7b] = '\0';
            attributes.stack_storage.aligned_char[0x7c] = '\0';
            attributes.stack_storage.aligned_char[0x7d] = '\0';
            attributes.stack_storage.aligned_char[0x7e] = '\0';
            attributes.stack_storage.aligned_char[0x7f] = '\0';
            attributes.stack_storage.aligned_char[0x80] = '\b';
            attributes.stack_storage.aligned_char[0x81] = '\0';
            attributes.stack_storage.aligned_char[0x82] = '\0';
            attributes.stack_storage.aligned_char[0x83] = '\0';
            attributes.stack_storage.aligned_char[0x84] = '\0';
            attributes.stack_storage.aligned_char[0x85] = '\0';
            attributes.stack_storage.aligned_char[0x86] = '\0';
            attributes.stack_storage.aligned_char[0x87] = '\0';
            attributes.stack_storage.aligned_char._168_8_ =
                 attributes.stack_storage.aligned_char + 0xc0;
            attributes.stack_storage.aligned_char[0xb0] = '\0';
            attributes.stack_storage.aligned_char[0xb1] = '\0';
            attributes.stack_storage.aligned_char[0xb2] = '\0';
            attributes.stack_storage.aligned_char[0xb3] = '\0';
            attributes.stack_storage.aligned_char[0xb4] = '\0';
            attributes.stack_storage.aligned_char[0xb5] = '\0';
            attributes.stack_storage.aligned_char[0xb6] = '\0';
            attributes.stack_storage.aligned_char[0xb7] = '\0';
            attributes.stack_storage.aligned_char[0xb8] = '\b';
            attributes.stack_storage.aligned_char[0xb9] = '\0';
            attributes.stack_storage.aligned_char[0xba] = '\0';
            attributes.stack_storage.aligned_char[0xbb] = '\0';
            attributes.stack_storage.aligned_char[0xbc] = '\0';
            attributes.stack_storage.aligned_char[0xbd] = '\0';
            attributes.stack_storage.aligned_char[0xbe] = '\0';
            attributes.stack_storage.aligned_char[0xbf] = '\0';
            attributes.stack_storage.aligned_char[0xe0] = '\0';
            attributes.stack_storage.aligned_char[0xe1] = '\0';
            attributes.stack_storage.aligned_char[0xe2] = '\0';
            attributes.stack_storage.aligned_char[0xe3] = '\0';
            attributes.stack_storage.aligned_char[0xe4] = '\0';
            attributes.stack_storage.aligned_char[0xe5] = '\0';
            attributes.stack_storage.aligned_char[0xe6] = '\0';
            attributes.stack_storage.aligned_char[0xe7] = '\0';
            attributes.stack_storage.aligned_char[0xe8] = '\0';
            attributes.stack_storage.aligned_char[0xe9] = '\0';
            attributes.stack_storage.aligned_char[0xea] = '\0';
            attributes.stack_storage.aligned_char[0xfc] = '\0';
            attributes.stack_storage.aligned_char[0xfd] = '\0';
            attributes.stack_storage.aligned_char[0xfe] = '\0';
            attributes.stack_storage.aligned_char[0xff] = '\0';
            attributes.stack_storage.aligned_char[0xec] = '\0';
            attributes.stack_storage.aligned_char[0xed] = '\0';
            attributes.stack_storage.aligned_char[0xee] = '\0';
            attributes.stack_storage.aligned_char[0xef] = '\0';
            attributes.stack_storage.aligned_char[0xf0] = '\0';
            attributes.stack_storage.aligned_char[0xf1] = '\0';
            attributes.stack_storage.aligned_char[0xf2] = '\0';
            attributes.stack_storage.aligned_char[0xf3] = '\0';
            attributes.stack_storage.aligned_char[0xf4] = '\0';
            attributes.stack_storage.aligned_char[0xf5] = '\0';
            attributes.stack_storage.aligned_char[0xf6] = '\0';
            attributes.stack_storage.aligned_char[0xf7] = '\0';
            attributes.stack_storage.aligned_char[0xf8] = '\0';
            attributes.stack_storage.aligned_char[0xf9] = '\0';
            attributes.stack_storage.aligned_char[0xfa] = '\0';
            attributes.stack_storage.aligned_char[0xfb] = '\0';
            this_01 = &(this->super_Compiler).ir;
            attributes.stack_storage.aligned_char._4_4_ =
                 attributes.stack_storage.aligned_char._0_4_;
            uVar4 = ParsedIR::increase_bound_by(this_01,1);
            attributes.
            super_VectorView<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            .buffer_size = CONCAT44(attributes.
                                    super_VectorView<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                    .buffer_size._4_4_,uVar4);
            decorations._M_dataplus._M_p._0_4_ =
                 Compiler::get_pointee_type_id(&this->super_Compiler,type_id_local);
            SmallVector<spirv_cross::TypedID<(spirv_cross::Types)1>,_8UL>::push_back
                      ((SmallVector<spirv_cross::TypedID<(spirv_cross::Types)1>,_8UL> *)
                       (attributes.stack_storage.aligned_char + 0x70),
                       (TypedID<(spirv_cross::Types)1> *)&decorations);
            ParsedIR::set_member_decoration
                      (this_01,attributes.
                               super_VectorView<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                               .buffer_size._0_4_,0,DecorationOffset,0);
            buffer_to_packing_standard_abi_cxx11_
                      (&local_1a0,this,(SPIRType *)&attributes,true,false);
            ::std::operator+(&decorations,&local_1a0,", ");
            ::std::__cxx11::string::operator=((string *)&flags,(string *)&decorations);
            ::std::__cxx11::string::~string((string *)&decorations);
            ::std::__cxx11::string::~string((string *)&local_1a0);
            SPIRType::~SPIRType((SPIRType *)&attributes);
          }
        }
        if (alignment == 0) {
          statement<char_const(&)[8],std::__cxx11::string&,char_const(&)[26],std::__cxx11::string&>
                    (this,(char (*) [8])"layout(",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&flags,
                     (char (*) [26])0x3a2798,&buffer_name);
        }
        else {
          statement<char_const(&)[8],std::__cxx11::string&,char_const(&)[44],unsigned_int&,char_const(&)[10],std::__cxx11::string&>
                    (this,(char (*) [8])"layout(",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&flags,
                     (char (*) [44])"buffer_reference, buffer_reference_align = ",&alignment,
                     (char (*) [10])0x3a27a8,&buffer_name);
        }
        ::std::__cxx11::string::~string((string *)&flags);
      }
      begin_scope(this);
      bVar2 = Compiler::is_physical_pointer_to_buffer_block(&this->super_Compiler,pSVar5);
      if (bVar2) {
        ::std::
        _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
        ::clear(&(pSVar5->member_name_cache)._M_h);
        pTVar1 = (pSVar5->member_types).
                 super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.ptr;
        uVar10 = 0;
        for (lVar9 = (pSVar5->member_types).
                     super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.buffer_size << 2
            ; lVar9 != 0; lVar9 = lVar9 + -4) {
          add_member_name(this,pSVar5,(uint32_t)uVar10);
          uVar3 = pTVar1[uVar10].id;
          ::std::__cxx11::string::string((string *)&attributes,"",(allocator *)&flags);
          (*(this->super_Compiler)._vptr_Compiler[0x15])
                    (this,pSVar5,(ulong)uVar3,uVar10 & 0xffffffff,&attributes,0);
          ::std::__cxx11::string::~string((string *)&attributes);
          uVar10 = uVar10 + 1;
        }
      }
      else {
        pSVar5 = Compiler::get_pointee_type(&this->super_Compiler,pSVar5);
        (*(this->super_Compiler)._vptr_Compiler[0x13])(&attributes,this,pSVar5,0);
        (*(this->super_Compiler)._vptr_Compiler[0x26])(&flags,this,pSVar5,0);
        statement<std::__cxx11::string,char_const(&)[7],std::__cxx11::string,char_const(&)[2]>
                  (this,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        &attributes,(char (*) [7])0x373a1c,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&flags,
                   (char (*) [2])0x3a919d);
        ::std::__cxx11::string::~string((string *)&flags);
        ::std::__cxx11::string::~string((string *)&attributes);
      }
      end_scope_decl(this);
      statement<char_const(&)[1]>(this,(char (*) [1])0x381f19);
      goto LAB_002d02e1;
    }
  }
  else {
    bVar2 = Compiler::is_physical_pointer_to_buffer_block(&this->super_Compiler,pSVar5);
    if (!bVar2) goto LAB_002cfcd3;
    ts_1 = (TypedID<(spirv_cross::Types)0> *)0x0;
    (*(this->super_Compiler)._vptr_Compiler[6])
              (&attributes,this,(ulong)(pSVar5->super_IVariant).self.id);
    __k = &(pSVar5->super_IVariant).self;
    ::std::__cxx11::string::operator=((string *)&buffer_name,(string *)&attributes);
    ::std::__cxx11::string::~string((string *)&attributes);
    this_00 = &(this->super_Compiler).ir.meta;
    pmVar6 = ::std::__detail::
             _Map_base<spirv_cross::TypedID<(spirv_cross::Types)0>,_std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>,_std::__detail::_Select1st,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
             ::operator[]((_Map_base<spirv_cross::TypedID<(spirv_cross::Types)0>,_std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>,_std::__detail::_Select1st,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                           *)this_00,__k);
    if ((pmVar6->decoration).alias._M_string_length == 0) {
LAB_002cfc0d:
      join<char_const(&)[2],spirv_cross::TypedID<(spirv_cross::Types)0>&>
                ((string *)&attributes,(spirv_cross *)0x38a666,(char (*) [2])__k,ts_1);
      ::std::__cxx11::string::operator=((string *)&buffer_name,(string *)&attributes);
      ::std::__cxx11::string::~string((string *)&attributes);
    }
    else {
      iVar7 = ::std::
              _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
              ::find(&(this->block_ssbo_names)._M_h,&buffer_name);
      if (iVar7.
          super__Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
          ._M_cur != (__node_type *)0x0) goto LAB_002cfc0d;
      iVar7 = ::std::
              _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
              ::find(&(this->resource_names)._M_h,&buffer_name);
      if (iVar7.
          super__Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
          ._M_cur != (__node_type *)0x0) goto LAB_002cfc0d;
    }
    name = &buffer_name;
    add_variable(this,&this->block_ssbo_names,&this->resource_names,name);
    if (buffer_name._M_string_length == 0) {
      join<char_const(&)[2],spirv_cross::TypedID<(spirv_cross::Types)0>&>
                ((string *)&attributes,(spirv_cross *)0x38a666,(char (*) [2])__k,
                 (TypedID<(spirv_cross::Types)0> *)name);
      ::std::__cxx11::string::operator=((string *)&buffer_name,(string *)&attributes);
      ::std::__cxx11::string::~string((string *)&attributes);
    }
    ::std::__detail::
    _Insert_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
    ::insert((_Insert_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
              *)&this->block_names,&buffer_name);
    ::std::__detail::
    _Insert_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
    ::insert((_Insert_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
              *)&this->block_ssbo_names,&buffer_name);
    pmVar6 = ::std::__detail::
             _Map_base<spirv_cross::TypedID<(spirv_cross::Types)0>,_std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>,_std::__detail::_Select1st,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
             ::operator[]((_Map_base<spirv_cross::TypedID<(spirv_cross::Types)0>,_std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>,_std::__detail::_Select1st,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                           *)this_00,__k);
    ::std::__cxx11::string::_M_assign((string *)pmVar6);
  }
  statement<char_const(&)[33],std::__cxx11::string&,char_const(&)[2]>
            (this,(char (*) [33])"layout(buffer_reference) buffer ",&buffer_name,
             (char (*) [2])0x3a919d);
LAB_002d02e1:
  ::std::__cxx11::string::~string((string *)&buffer_name);
  return;
}

Assistant:

void CompilerGLSL::emit_buffer_reference_block(uint32_t type_id, bool forward_declaration)
{
	auto &type = get<SPIRType>(type_id);
	string buffer_name;

	if (forward_declaration && is_physical_pointer_to_buffer_block(type))
	{
		// Block names should never alias, but from HLSL input they kind of can because block types are reused for UAVs ...
		// Allow aliased name since we might be declaring the block twice. Once with buffer reference (forward declared) and one proper declaration.
		// The names must match up.
		buffer_name = to_name(type.self, false);

		// Shaders never use the block by interface name, so we don't
		// have to track this other than updating name caches.
		// If we have a collision for any reason, just fallback immediately.
		if (ir.meta[type.self].decoration.alias.empty() ||
		    block_ssbo_names.find(buffer_name) != end(block_ssbo_names) ||
		    resource_names.find(buffer_name) != end(resource_names))
		{
			buffer_name = join("_", type.self);
		}

		// Make sure we get something unique for both global name scope and block name scope.
		// See GLSL 4.5 spec: section 4.3.9 for details.
		add_variable(block_ssbo_names, resource_names, buffer_name);

		// If for some reason buffer_name is an illegal name, make a final fallback to a workaround name.
		// This cannot conflict with anything else, so we're safe now.
		// We cannot reuse this fallback name in neither global scope (blocked by block_names) nor block name scope.
		if (buffer_name.empty())
			buffer_name = join("_", type.self);

		block_names.insert(buffer_name);
		block_ssbo_names.insert(buffer_name);

		// Ensure we emit the correct name when emitting non-forward pointer type.
		ir.meta[type.self].decoration.alias = buffer_name;
	}
	else
	{
		buffer_name = type_to_glsl(type);
	}

	if (!forward_declaration)
	{
		auto itr = physical_storage_type_to_alignment.find(type_id);
		uint32_t alignment = 0;
		if (itr != physical_storage_type_to_alignment.end())
			alignment = itr->second.alignment;

		if (is_physical_pointer_to_buffer_block(type))
		{
			SmallVector<std::string> attributes;
			attributes.push_back("buffer_reference");
			if (alignment)
				attributes.push_back(join("buffer_reference_align = ", alignment));
			attributes.push_back(buffer_to_packing_standard(type, true, true));

			auto flags = ir.get_buffer_block_type_flags(type);
			string decorations;
			if (flags.get(DecorationRestrict))
				decorations += " restrict";
			if (flags.get(DecorationCoherent))
				decorations += " coherent";
			if (flags.get(DecorationNonReadable))
				decorations += " writeonly";
			if (flags.get(DecorationNonWritable))
				decorations += " readonly";

			statement("layout(", merge(attributes), ")", decorations, " buffer ", buffer_name);
		}
		else
		{
			string packing_standard;
			if (type.basetype == SPIRType::Struct)
			{
				// The non-block type is embedded in a block, so we cannot use enhanced layouts :(
				packing_standard = buffer_to_packing_standard(type, true, false) + ", ";
			}
			else if (is_array(get_pointee_type(type)))
			{
				SPIRType wrap_type{OpTypeStruct};
				wrap_type.self = ir.increase_bound_by(1);
				wrap_type.member_types.push_back(get_pointee_type_id(type_id));
				ir.set_member_decoration(wrap_type.self, 0, DecorationOffset, 0);
				packing_standard = buffer_to_packing_standard(wrap_type, true, false) + ", ";
			}

			if (alignment)
				statement("layout(", packing_standard, "buffer_reference, buffer_reference_align = ", alignment, ") buffer ", buffer_name);
			else
				statement("layout(", packing_standard, "buffer_reference) buffer ", buffer_name);
		}

		begin_scope();

		if (is_physical_pointer_to_buffer_block(type))
		{
			type.member_name_cache.clear();

			uint32_t i = 0;
			for (auto &member : type.member_types)
			{
				add_member_name(type, i);
				emit_struct_member(type, member, i);
				i++;
			}
		}
		else
		{
			auto &pointee_type = get_pointee_type(type);
			statement(type_to_glsl(pointee_type), " value", type_to_array_glsl(pointee_type, 0), ";");
		}

		end_scope_decl();
		statement("");
	}
	else
	{
		statement("layout(buffer_reference) buffer ", buffer_name, ";");
	}
}